

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void __thiscall
Test_TemplateModifiers_XmlEscape::Test_TemplateModifiers_XmlEscape
          (Test_TemplateModifiers_XmlEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, XmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestXmlEscape", NULL);
  dict.SetEscapedValue("no XML", "",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("easy XML", "xoo",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("harder XML-1", "<>&'\"",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("harder XML-2", "Hello<script>alert('&')</script>",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("hardest XML", "<<b>>&!''\"\"foo",
                       GOOGLE_NAMESPACE::xml_escape);
  // Characters 0x00-0x1F (except \t, \r and \n) are not valid for XML and
  // compliant parsers are allowed to die when they encounter them. They
  // should be replaced with spaces.
  dict.SetEscapedValue("Spacey XML", " \r\n\f",
                       GOOGLE_NAMESPACE::xml_escape);
  dict.SetEscapedValue("XML with control chars",
                       "\x01\x02\x03\x09\x0A\x0B\x0D\x15\x16\x1F",
                       GOOGLE_NAMESPACE::xml_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("no XML"), "");
  EXPECT_STREQ(peer.GetSectionValue("easy XML"), "xoo");
  EXPECT_STREQ(peer.GetSectionValue("harder XML-1"),
               "&lt;&gt;&amp;&#39;&quot;");
  EXPECT_STREQ(peer.GetSectionValue("harder XML-2"),
               "Hello&lt;script&gt;alert(&#39;&amp;&#39;)&lt;/script&gt;");
  EXPECT_STREQ(peer.GetSectionValue("hardest XML"),
               "&lt;&lt;b&gt;&gt;&amp;!&#39;&#39;&quot;&quot;foo");
  EXPECT_STREQ(peer.GetSectionValue("Spacey XML"),
               " \r\n ");
  EXPECT_STREQ(peer.GetSectionValue("XML with control chars"),
               "   \t\n \r   ");
}